

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O2

void __thiscall b_tree_node::b_tree_node(b_tree_node *this,b_tree_node *obj)

{
  int64_t *piVar1;
  pager *this_00;
  uint64_t ofs;
  ushort *puVar2;
  ulong uVar3;
  pair<unsigned_char_*,_unsigned_char_*> pVar4;
  
  this_00 = obj->_p;
  this->_p = this_00;
  ofs = obj->_ofs_field;
  this->_ofs_field = ofs;
  pager::map_page_from(&this->_mm,this_00,ofs);
  this->_valid_keys_field = (uint8_t *)0x0;
  this->_vals_field = (int64_t *)0x0;
  this->_num_keys_field = (uint16_t *)0x0;
  this->_keys_field = (int64_t *)0x0;
  this->_min_degree_field = (uint16_t *)0x0;
  this->_leaf_field = (uint16_t *)0x0;
  this->_child_ofs_field = (int64_t *)0x0;
  pVar4 = r_memory_map::map(&this->_mm);
  puVar2 = (ushort *)pVar4.first;
  this->_min_degree_field = puVar2;
  this->_leaf_field = puVar2 + 1;
  this->_num_keys_field = puVar2 + 2;
  this->_keys_field = (int64_t *)(puVar2 + 3);
  uVar3 = (ulong)*puVar2;
  this->_valid_keys_field = (uint8_t *)(puVar2 + uVar3 * 8 + -1);
  piVar1 = (int64_t *)((long)(puVar2 + uVar3 * 8 + -1) + uVar3 * 2 + -1);
  this->_vals_field = piVar1;
  this->_child_ofs_field = piVar1 + uVar3 * 2 + -1;
  return;
}

Assistant:

b_tree_node::b_tree_node(const b_tree_node& obj) :
    _p(obj._p),
    _ofs_field(obj._ofs_field),
    _mm(_p.map_page_from(_ofs_field)),
    _min_degree_field(nullptr),
    _leaf_field(nullptr),
    _num_keys_field(nullptr),
    _keys_field(nullptr),
    _valid_keys_field(nullptr),
    _vals_field(nullptr),
    _child_ofs_field(nullptr)
{
    auto read_ptr = _mm.map().first;

    _min_degree_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _leaf_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _num_keys_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _keys_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _valid_keys_field = (uint8_t*)read_ptr;
    read_ptr += sizeof(uint8_t) * ((*_min_degree_field * 2) - 1);

    _vals_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _child_ofs_field = (int64_t*)read_ptr;
}